

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::ProgramBinaryUniformResetCase::verifyUniformsReset
          (ProgramBinaryUniformResetCase *this,ShaderProgram *program)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_120 [264];
  
  local_198._0_8_ =
       ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Verifying uniform reset to 0/false.",0x23);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_120);
  pTVar1 = (TestLog *)(local_198 + 0x10);
  local_198._0_8_ = pTVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"u_boolVar","");
  verifyUniformInt(this,program,(string *)local_198);
  if ((TestLog *)local_198._0_8_ != pTVar1) {
    operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
  }
  local_198._0_8_ = pTVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"u_intVar","");
  verifyUniformInt(this,program,(string *)local_198);
  if ((TestLog *)local_198._0_8_ != pTVar1) {
    operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
  }
  local_198._0_8_ = pTVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"u_floatVar","");
  verifyUniformFloat(this,program,(string *)local_198);
  if ((TestLog *)local_198._0_8_ != pTVar1) {
    operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void verifyUniformsReset (glu::ShaderProgram& program)
	{
		m_testCtx.getLog() << TestLog::Message << "Verifying uniform reset to 0/false." << TestLog::EndMessage;

		verifyUniformInt	(program,	"u_boolVar");
		verifyUniformInt	(program,	"u_intVar");
		verifyUniformFloat	(program,	"u_floatVar");
	}